

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

void __thiscall
FastLinearExpert::FastLinearExpert(FastLinearExpert *this,int d,int D,Z *z,X *x,IMLE *_mixture)

{
  ZZ *this_00;
  X *this_01;
  Z *pZVar1;
  XZ *pXVar2;
  ZZ *this_02;
  double *pdVar3;
  double *pdVar4;
  IMLE *pIVar5;
  plainobjectbase_evaluator_data<double,_0> pVar6;
  double *pdVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  XprTypeNested pMVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  ActualDstType actualDst_3;
  long rows;
  ActualDstType actualDst_1;
  double dVar17;
  Scal SVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Z Sigma0;
  ActualDstType actualDst;
  Z SZ;
  ThisEvaluator thisEval;
  scalar_sum_op<double,_double> local_d9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_d8;
  Scal local_c8;
  undefined8 uStack_c0;
  plainobjectbase_evaluator_data<double,_0> local_b8;
  plainobjectbase_evaluator_data<double,_0> local_b0;
  plainobjectbase_evaluator_data<double,_0> local_a8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_a0;
  X *local_80;
  Z *local_78;
  undefined1 local_70 [16];
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_60;
  scalar_constant_op<double> local_58;
  RhsNested local_48;
  
  (this->super_LinearExpert).d = d;
  (this->super_LinearExpert).D = D;
  (this->super_LinearExpert).dGamma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).dGamma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Nu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Nu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_storage.m_rows = 0;
  (this->super_LinearExpert).Lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_storage.m_cols = 0;
  (this->super_LinearExpert).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).Psi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Psi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).invPsi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).invPsi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sxz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sxz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sxz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->super_LinearExpert).Szz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Szz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Szz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->super_LinearExpert).Sxx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sxx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Nu0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Nu0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).pred_x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).pred_x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).pred_z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).pred_z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  local_80 = x;
  memset(&(this->super_LinearExpert).dNewGamma,0,0x88);
  (this->super_LinearExpert).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).Sigma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sigma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sigma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->super_LinearExpert).PsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).PsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).PsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).LambdaPsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).LambdaPsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).LambdaPsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).p_x_invVar.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).p_x_invVar.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).p_x_invVar.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).recompute = true;
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  this->mixture = _mixture;
  (this->super_LinearExpert).alpha = (_mixture->param).alpha;
  (this->super_LinearExpert).wPsi = (_mixture->param).wPsi;
  dVar17 = (_mixture->param).wNu;
  (this->super_LinearExpert).wNu = dVar17;
  (this->super_LinearExpert).wSigma =
       (double)d + (_mixture->param).wSigma +
       *(double *)(&DAT_0018cd10 + (ulong)(-(uint)(dVar17 == 0.0) & 1) * 8);
  (this->super_LinearExpert).wLambda = (_mixture->param).wLambda;
  local_b8.data = (double *)&(this->super_LinearExpert).Nu0;
  pdVar7 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar13 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_78 = z;
  if ((this->super_LinearExpert).Nu0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != lVar13) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b8.data,lVar13,1);
  }
  pdVar15 = (this->super_LinearExpert).Nu0.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar11 = (this->super_LinearExpert).Nu0.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  uVar9 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar11) {
    lVar13 = 0;
    do {
      pdVar3 = pdVar7 + lVar13;
      dVar17 = pdVar3[1];
      pdVar4 = pdVar15 + lVar13;
      *pdVar4 = *pdVar3;
      pdVar4[1] = dVar17;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar9);
  }
  if ((long)uVar9 < (long)uVar11) {
    do {
      pdVar15[uVar9] = pdVar7[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  pZVar1 = &(this->super_LinearExpert).Sz;
  (this->super_LinearExpert).H = 1e-06;
  (this->super_LinearExpert).Sh = 0.0;
  lVar13 = (long)d;
  if ((this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != lVar13) {
    free((pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data);
    if (d < 1) {
      pdVar7 = (double *)0x0;
    }
    else {
      pdVar7 = (double *)malloc(lVar13 * 8);
      if (pdVar7 == (double *)0x0) goto LAB_0015428c;
    }
    (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar7;
  }
  (this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = lVar13;
  if (0 < d) {
    memset((pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           ,0,lVar13 * 8);
  }
  rows = (long)D;
  if ((this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != rows) {
    free((this->super_LinearExpert).Sx.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    if (D < 1) {
      pdVar7 = (double *)0x0;
    }
    else {
      pdVar7 = (double *)malloc(rows * 8);
      if (pdVar7 == (double *)0x0) goto LAB_0015428c;
    }
    (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = pdVar7;
  }
  (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = rows;
  if (0 < D) {
    memset((this->super_LinearExpert).Sx.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
           rows * 8);
  }
  if ((d == 0 || D == 0) ||
     (rows <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar13),0))) {
    pXVar2 = &(this->super_LinearExpert).Sxz;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)pXVar2,rows * lVar13,rows,lVar13);
    lVar10 = (this->super_LinearExpert).Sxz.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols *
             (this->super_LinearExpert).Sxz.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    if (0 < lVar10) {
      memset((pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data,0,lVar10 * 8);
    }
    local_c8 = (this->super_LinearExpert).wPsi;
    uStack_c0 = 0;
    pdVar7 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar10 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if ((this->super_LinearExpert).Sxx.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != lVar10) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->super_LinearExpert).Sxx.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar10,1);
    }
    pdVar15 = (this->super_LinearExpert).Sxx.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar11 = (this->super_LinearExpert).Sxx.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    uVar9 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar11) {
      lVar10 = 0;
      do {
        pdVar3 = pdVar7 + lVar10;
        dVar17 = pdVar3[1];
        pdVar4 = pdVar15 + lVar10;
        *pdVar4 = *pdVar3 * local_c8;
        pdVar4[1] = dVar17 * local_c8;
        lVar10 = lVar10 + 2;
      } while (lVar10 < (long)uVar9);
    }
    if ((long)uVar9 < (long)uVar11) {
      do {
        pdVar15[uVar9] = pdVar7[uVar9] * local_c8;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    if ((d == 0) ||
       (lVar13 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar13),0))) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->invSzz,lVar13 * lVar13,lVar13,lVar13)
      ;
      auVar21 = _DAT_0018b020;
      auVar20 = _DAT_0018b010;
      pdVar7 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      lVar10 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      uVar11 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
      if (0 < (long)uVar11) {
        lVar14 = lVar10 + -1;
        auVar19._8_4_ = (int)lVar14;
        auVar19._0_8_ = lVar14;
        auVar19._12_4_ = (int)((ulong)lVar14 >> 0x20);
        pdVar15 = pdVar7 + 1;
        uVar9 = 0;
        auVar19 = auVar19 ^ _DAT_0018b020;
        do {
          if (0 < lVar10) {
            uVar16 = 0;
            auVar22 = auVar20;
            do {
              auVar23 = auVar22 ^ auVar21;
              if ((bool)(~(auVar19._4_4_ < auVar23._4_4_ ||
                          auVar19._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar19._4_4_) & 1)) {
                dVar17 = 1.0;
                if (uVar9 != uVar16) {
                  dVar17 = 0.0;
                }
                pdVar15[uVar16 - 1] = dVar17;
              }
              if (auVar23._12_4_ <= auVar19._12_4_ &&
                  (auVar23._8_4_ <= auVar19._8_4_ || auVar23._12_4_ != auVar19._12_4_)) {
                dVar17 = 1.0;
                if (uVar9 - 1 != uVar16) {
                  dVar17 = 0.0;
                }
                pdVar15[uVar16] = dVar17;
              }
              uVar16 = uVar16 + 2;
              lVar14 = auVar22._8_8_;
              auVar22._0_8_ = auVar22._0_8_ + 2;
              auVar22._8_8_ = lVar14 + 2;
            } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar16);
          }
          uVar9 = uVar9 + 1;
          pdVar15 = pdVar15 + lVar10;
        } while (uVar9 != uVar11);
      }
      dVar17 = (this->super_LinearExpert).wLambda;
      lVar10 = uVar11 * lVar10;
      uVar11 = lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < lVar10) {
        auVar20._8_8_ = dVar17;
        auVar20._0_8_ = dVar17;
        lVar14 = 0;
        do {
          auVar21 = divpd(*(undefined1 (*) [16])(pdVar7 + lVar14),auVar20);
          *(undefined1 (*) [16])(pdVar7 + lVar14) = auVar21;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)uVar11);
      }
      if ((long)uVar11 < lVar10) {
        do {
          pdVar7[uVar11] = pdVar7[uVar11] / dVar17;
          uVar11 = uVar11 + 1;
        } while (lVar10 - uVar11 != 0);
      }
      pIVar5 = this->mixture;
      local_c8 = (pIVar5->param).wSigma;
      uStack_c0 = 0;
      local_d8.m_storage.m_data = (double *)0x0;
      local_d8.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_d8,
                 (pIVar5->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows,1);
      pdVar7 = (pIVar5->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pMVar12 = (XprTypeNested)
                (pIVar5->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
      if ((XprTypeNested)local_d8.m_storage.m_rows != pMVar12) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_d8,(Index)pMVar12,1);
      }
      pMVar12 = (XprTypeNested)
                (local_d8.m_storage.m_rows - (local_d8.m_storage.m_rows >> 0x3f) &
                0xfffffffffffffffe);
      if (1 < local_d8.m_storage.m_rows) {
        lVar10 = 0;
        do {
          pdVar15 = pdVar7 + lVar10;
          dVar17 = pdVar15[1];
          *(double *)((long)local_d8.m_storage.m_data + lVar10 * 8) = *pdVar15 * local_c8;
          *(double *)
           ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
            ((long)local_d8.m_storage.m_data + lVar10 * 8) + 8) = dVar17 * local_c8;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)pMVar12);
      }
      if ((long)pMVar12 < local_d8.m_storage.m_rows) {
        do {
          *(double *)((long)local_d8.m_storage.m_data + (long)pMVar12 * 8) =
               pdVar7[(long)pMVar12] * local_c8;
          pMVar12 = (XprTypeNested)
                    ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            ).m_storage.m_data + 1);
        } while ((XprTypeNested)local_d8.m_storage.m_rows != pMVar12);
      }
      local_70._8_8_ = &local_d8;
      local_c8 = (Scal)rows;
      if (((XprTypeNested)local_d8.m_storage.m_rows != (XprTypeNested)0x0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                 SEXT816(local_d8.m_storage.m_rows),0) < local_d8.m_storage.m_rows)) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = operator_delete;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      this_02 = &this->invSzz0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this_02,
                 local_d8.m_storage.m_rows * local_d8.m_storage.m_rows,local_d8.m_storage.m_rows,
                 local_d8.m_storage.m_rows);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Diagonal2Dense,_void>
      ::run(this_02,(DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_70,(assign_op<double,_double> *)&local_a0);
      pVar6.data = local_b8.data;
      local_70._8_8_ = local_b8.data;
      local_70._0_8_ = this_02;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b0,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)local_70);
      local_a0.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d._0_8_ = pVar6.data;
      local_a0.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&local_b0;
      if ((XprTypeNested)local_a8.data == (XprTypeNested)0x0) {
        local_b8.data = (double *)0x0;
      }
      else {
        local_70._8_8_ = *pVar6.data;
        local_60.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)local_b0.data;
        local_b8.data =
             (double *)
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_70,&local_d9,
                        (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&local_a0);
      }
      local_58.m_other = 1.0 / (this->super_LinearExpert).wNu + (double)local_b8.data;
      local_70._8_8_ = local_a8.data;
      local_70._0_8_ = &local_b0;
      local_48.m_matrix = (non_const_type)&local_b0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,0>,Eigen::internal::sub_assign_op<double,double>>
                (this_02,(Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
                          *)local_70,(sub_assign_op<double,_double> *)&local_a0,(type)0x0);
      SVar18 = local_c8;
      dVar17 = 1.0;
      if ((XprTypeNested)local_d8.m_storage.m_rows != (XprTypeNested)0x0) {
        local_70._0_8_ = local_d8.m_storage.m_data;
        dVar17 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
                 ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                           ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_70,
                            (scalar_product_op<double,_double> *)&local_a0,
                            (Matrix<double,__1,_1,_0,__1,_1> *)&local_d8);
      }
      this->detInvSzz0 =
           (1.0 / dVar17) / ((double)local_b8.data * (this->super_LinearExpert).wNu + 1.0);
      pdVar7 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      lVar10 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      if ((this->super_LinearExpert).Nu.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != lVar10)
      {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->super_LinearExpert).Nu.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar10,1);
      }
      pdVar15 = (this->super_LinearExpert).Nu.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar11 = (this->super_LinearExpert).Nu.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      uVar9 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar11) {
        lVar10 = 0;
        do {
          pdVar3 = pdVar7 + lVar10;
          dVar17 = pdVar3[1];
          pdVar4 = pdVar15 + lVar10;
          *pdVar4 = *pdVar3;
          pdVar4[1] = dVar17;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)uVar9);
      }
      if ((long)uVar9 < (long)uVar11) {
        do {
          pdVar15[uVar9] = pdVar7[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      pdVar7 = (local_80->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      lVar10 = (local_80->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      if ((this->super_LinearExpert).Mu.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != lVar10)
      {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->super_LinearExpert).Mu.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar10,1);
      }
      pdVar15 = (this->super_LinearExpert).Mu.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar11 = (this->super_LinearExpert).Mu.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      uVar9 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar11) {
        lVar10 = 0;
        do {
          pdVar3 = pdVar7 + lVar10;
          dVar17 = pdVar3[1];
          pdVar4 = pdVar15 + lVar10;
          *pdVar4 = *pdVar3;
          pdVar4[1] = dVar17;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)uVar9);
      }
      if ((long)uVar9 < (long)uVar11) {
        do {
          pdVar15[uVar9] = pdVar7[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      if ((d != 0 && D != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar13),0) <
          (long)SVar18)) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = operator_delete;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pXVar2 = &(this->super_LinearExpert).Lambda;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)pXVar2,rows * lVar13,(Index)SVar18,lVar13);
      lVar13 = (this->super_LinearExpert).Lambda.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols *
               (this->super_LinearExpert).Lambda.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      if (0 < lVar13) {
        memset((pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data,0,lVar13 * 8);
      }
      local_48.m_matrix = (non_const_type)(this->super_LinearExpert).wSigma;
      local_60.m_d.data = (plainobjectbase_evaluator_data<double,_0>)&local_d8;
      local_58.m_other = (double)local_d8.m_storage.m_rows;
      if (((XprTypeNested)local_d8.m_storage.m_rows != (XprTypeNested)0x0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                 SEXT816(local_d8.m_storage.m_rows),0) < local_d8.m_storage.m_rows)) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = operator_delete;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      this_00 = &(this->super_LinearExpert).invSigma;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this_00,
                 local_d8.m_storage.m_rows * local_d8.m_storage.m_rows,local_d8.m_storage.m_rows,
                 local_d8.m_storage.m_rows);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Diagonal2Dense,_void>
      ::run(this_00,(DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                     *)local_70,(assign_op<double,_double> *)&local_a0);
      local_58.m_other = (this->super_LinearExpert).wSigma;
      local_70._0_8_ = &local_d8;
      local_70._8_8_ = local_d8.m_storage.m_rows;
      dVar17 = 1.0;
      if ((XprTypeNested)local_d8.m_storage.m_rows != (XprTypeNested)0x0) {
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_d8.m_storage.m_data;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .m_functor.m_other = local_58.m_other;
        dVar17 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                           (&local_a0,(scalar_product_op<double,_double> *)&local_d9,
                            (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)local_70);
      }
      dVar17 = 1.0 / dVar17;
      if (dVar17 < 0.0) {
        SVar18 = sqrt(dVar17);
      }
      else {
        SVar18 = SQRT(dVar17);
      }
      (this->super_LinearExpert).sqrtDetInvSigma = SVar18;
      local_c8 = 2.0 / (this->super_LinearExpert).wPsi;
      uStack_c0 = 0;
      pdVar7 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      lVar13 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if ((this->super_LinearExpert).Psi.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != lVar13)
      {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->super_LinearExpert).Psi.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar13,1);
      }
      auVar21._0_8_ = local_c8 + 1.0;
      pdVar15 = (this->super_LinearExpert).Psi.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar11 = (this->super_LinearExpert).Psi.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      uVar9 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar11) {
        auVar21._8_8_ = auVar21._0_8_;
        lVar13 = 0;
        do {
          auVar20 = divpd(*(undefined1 (*) [16])(pdVar7 + lVar13),auVar21);
          *(undefined1 (*) [16])(pdVar15 + lVar13) = auVar20;
          lVar13 = lVar13 + 2;
        } while (lVar13 < (long)uVar9);
      }
      if ((long)uVar9 < (long)uVar11) {
        do {
          pdVar15[uVar9] = pdVar7[uVar9] / auVar21._0_8_;
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      this_01 = &(this->super_LinearExpert).invPsi;
      pdVar7 = (this->super_LinearExpert).Psi.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar13 = (this->super_LinearExpert).Psi.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_c8 = auVar21._0_8_;
      if ((this->super_LinearExpert).invPsi.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != lVar13)
      {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar13,1
                  );
      }
      auVar20 = _DAT_0018cd00;
      pdVar15 = (this->super_LinearExpert).invPsi.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar11 = (this->super_LinearExpert).invPsi.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      uVar9 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar11) {
        lVar13 = 0;
        do {
          auVar21 = divpd(auVar20,*(undefined1 (*) [16])(pdVar7 + lVar13));
          *(undefined1 (*) [16])(pdVar15 + lVar13) = auVar21;
          lVar13 = lVar13 + 2;
        } while (lVar13 < (long)uVar9);
      }
      if ((long)uVar9 < (long)uVar11) {
        do {
          pdVar15[uVar9] = 1.0 / pdVar7[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      if ((this->super_LinearExpert).invPsi.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0) {
        dVar17 = 1.0;
      }
      else {
        local_70._0_8_ =
             (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        dVar17 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
                 ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                           ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_70,
                            (scalar_product_op<double,_double> *)&local_a0,this_01);
      }
      if (dVar17 < 0.0) {
        SVar18 = sqrt(dVar17);
      }
      else {
        SVar18 = SQRT(dVar17);
      }
      (this->super_LinearExpert).sqrtDetInvPsi = SVar18;
      (this->super_LinearExpert).recompute = true;
      free(local_b0.data);
      free(local_d8.m_storage.m_data);
      return;
    }
  }
LAB_0015428c:
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = operator_delete;
  __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

FAST_LINEAR_EXPERT_base::FastLinearExpert(Z const &z, X const &x, IMLE<d,D,::FastLinearExpert> *_mixture)
#endif
{
    mixture = _mixture;

    alpha = mixture->getParameters().alpha;
    wPsi = mixture->getParameters().wPsi;
    wNu = mixture->getParameters().wNu;
    wSigma = mixture->getParameters().wSigma + d + ((wNu==0) ? 1.0 : 2.0);
    wLambda = mixture->getParameters().wLambda;

    Nu0 = z;


    H = EPSILON;

    Sh = 0.0;
    Sz.setZero(d);
    Sx.setZero(D);
    Sxz.setZero(D,d);
    Sxx = wPsi * mixture->getPsi();
//Sxx = X::Zero(D);
    invSzz.setIdentity(d,d) /= wLambda;
    Z Sigma0 = mixture->getParameters().wSigma*mixture->getSigma();
    invSzz0 = Sigma0.cwiseInverse().asDiagonal();
	// Using Moore-Penrose Rank-1 update
	Z SZ = invSzz0 * Nu0;
	Scal DOT = Nu0.dot(SZ);
	Scal DEN = DOT + 1 / wNu;
	invSzz0 -= (SZ/DEN) * SZ.transpose();

	// Using Determinant Rank-1 update
	detInvSzz0 = 1.0 / Sigma0.prod();
	detInvSzz0 /= (DOT*wNu + 1.0);

    Nu = z;
    Mu = x;
    Lambda.setZero(D,d);
    invSigma = (Sigma0/wSigma).cwiseInverse().asDiagonal();
    sqrtDetInvSigma = sqrt( 1.0 / (Sigma0/wSigma).prod() );

    Psi = mixture->getPsi() / (1.0 + 2.0/wPsi) ;
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

//    invSzz.setIdentity(d,d) /= EPSILON;
//    invSzz0.setIdentity(d,d) /= this->w0 * this->sigma;
//    detInvSzz0 = 1.0 / pow(this->w0 * this->sigma, d);
//
//    this->Nu = z;
//    this->Mu = x;
//    this->Lambda.setZero(D,d);
//    this->invSSEzz.setZero(d,d);
//
//    this->invSigma.setIdentity(d,d) *=  (this->w0+d+1.0)/(this->w0*this->sigma);
//    this->sqrtDetInvSigma = pow((this->w0+d+1.0)/(this->w0*this->sigma), d/2.0);
//
//    this->recompute = true;
    recompute = true;
}